

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O0

Vec_Int_t * Gia_ManLutCollect(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  int *piVar4;
  Vec_Int_t *p_02;
  int Dist;
  int *pPerm;
  int iFan;
  int Id;
  int k;
  int i;
  Vec_Int_t *vOrder;
  Vec_Int_t *vDist;
  Vec_Int_t *vLuts;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManAndNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (pPerm._4_4_ = 1; iVar1 = Gia_ManObjNum(p), pPerm._4_4_ < iVar1; pPerm._4_4_ = pPerm._4_4_ + 1
      ) {
    iVar1 = Gia_ObjIsLut(p,pPerm._4_4_);
    if (iVar1 != 0) {
      Vec_IntPush(p_00,pPerm._4_4_);
    }
  }
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntStart(iVar1);
  for (Id = 0; iVar1 = Vec_IntSize(p->vCos), Id < iVar1; Id = Id + 1) {
    pObj = Gia_ManCo(p,Id);
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    Vec_IntWriteEntry(p_01,iVar1,1);
  }
  Id = Vec_IntSize(p_00);
  while (Id = Id + -1, -1 < Id) {
    iVar1 = Vec_IntEntry(p_00,Id);
    iVar2 = Vec_IntEntry(p_01,iVar1);
    for (iFan = 0; iVar3 = Gia_ObjLutSize(p,iVar1), iFan < iVar3; iFan = iFan + 1) {
      piVar4 = Gia_ObjLutFanins(p,iVar1);
      Vec_IntUpdateEntry(p_01,piVar4[iFan],iVar2 + 1);
    }
  }
  iFan = 0;
  for (Id = 0; iVar1 = Vec_IntSize(p_00), Id < iVar1; Id = Id + 1) {
    iVar1 = Vec_IntEntry(p_00,Id);
    iVar1 = Vec_IntEntry(p_01,iVar1);
    Vec_IntWriteEntry(p_01,iFan,-iVar1);
    iFan = iFan + 1;
  }
  Vec_IntShrink(p_01,iFan);
  piVar4 = Vec_IntArray(p_01);
  iVar1 = Vec_IntSize(p_01);
  piVar4 = Abc_MergeSortCost(piVar4,iVar1);
  iVar1 = Vec_IntSize(p_00);
  p_02 = Vec_IntAlloc(iVar1);
  for (Id = 0; iVar1 = Vec_IntSize(p_00), Id < iVar1; Id = Id + 1) {
    iVar1 = Vec_IntEntry(p_00,piVar4[Id]);
    Vec_IntPush(p_02,iVar1);
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_00);
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  return p_02;
}

Assistant:

Vec_Int_t * Gia_ManLutCollect( Gia_Man_t * p )
{
    Vec_Int_t * vLuts, * vDist, * vOrder;
    int i, k, Id, iFan, * pPerm;
    // collect LUTs
    vLuts = Vec_IntAlloc( Gia_ManAndNum(p) );
    Gia_ManForEachLut( p, Id )
        Vec_IntPush( vLuts, Id );
    // propagate distance
    vDist = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachCoDriverId( p, Id, i )
        Vec_IntWriteEntry( vDist, Id, 1 );
    Vec_IntForEachEntryReverse( vLuts, Id, i )
    {
        int Dist = 1 + Vec_IntEntry(vDist, Id);
        Gia_LutForEachFanin( p, Id, iFan, k )
            Vec_IntUpdateEntry( vDist, iFan, Dist );
    }
    // sort LUTs by distance
    k = 0;
    Vec_IntForEachEntry( vLuts, Id, i )
        Vec_IntWriteEntry( vDist, k++, -Vec_IntEntry(vDist, Id) );
    Vec_IntShrink( vDist, k );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vDist), Vec_IntSize(vDist) );
    // collect
    vOrder = Vec_IntAlloc( Vec_IntSize(vLuts) );
    for ( i = 0; i < Vec_IntSize(vLuts); i++ )
        Vec_IntPush( vOrder, Vec_IntEntry(vLuts, pPerm[i]) );
    Vec_IntFree( vDist );
    Vec_IntFree( vLuts );
    ABC_FREE( pPerm );
    return vOrder;
}